

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

void google::protobuf::compiler::cpp::GatherAllCustomOptionTypes
               (FileDescriptor *file,
               btree_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>_>
               *out)

{
  initializer_list<const_google::protobuf::Message_*> __l;
  int iVar1;
  bool bVar2;
  int iVar3;
  DescriptorPool *this;
  Descriptor *pDVar4;
  Message *pMVar5;
  MessageLite *this_00;
  LogMessage *pLVar6;
  reference ppMVar7;
  Reflection *this_01;
  reference ppFVar8;
  mapped_type *ppDVar9;
  string_view sVar10;
  Message *local_2a0;
  Message *local_298;
  int local_28c;
  undefined1 auStack_288 [4];
  int i;
  char *local_280;
  Descriptor *local_278;
  Descriptor *field_msg;
  char *local_268;
  Descriptor *local_260;
  Descriptor *desc;
  FieldDescriptor *field;
  iterator __end4;
  iterator __begin4;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range4;
  Reflection *reflection;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  Message *msg;
  pointer local_208;
  iterator local_200;
  size_type local_1f8;
  undefined1 local_1f0 [8];
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  to_process;
  LogMessage local_1d0;
  Voidify local_1b9;
  string local_1b8;
  string_view local_198;
  undefined1 local_188 [8];
  FileDescriptorProto linkedin_fd_proto;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> local_80;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> fd_proto;
  DynamicMessageFactory factory;
  Descriptor *fd_proto_descriptor;
  DescriptorPool *pool;
  btree_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_google::protobuf::Descriptor_*>_>_>
  *out_local;
  FileDescriptor *file_local;
  
  this = FileDescriptor::pool(file);
  pDVar4 = FileDescriptorProto::descriptor();
  sVar10 = Descriptor::full_name(pDVar4);
  pDVar4 = DescriptorPool::FindMessageTypeByName(this,sVar10);
  if (pDVar4 != (Descriptor *)0x0) {
    DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)&fd_proto,this);
    pMVar5 = DynamicMessageFactory::GetPrototype((DynamicMessageFactory *)&fd_proto,pDVar4);
    pMVar5 = Message::New(pMVar5);
    std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>::
    unique_ptr<std::default_delete<google::protobuf::Message>,void>
              ((unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>
                *)&local_80,pMVar5);
    FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_188);
    FileDescriptor::CopyTo(file,(FileDescriptorProto *)local_188);
    this_00 = &std::
               unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
               ::operator->(&local_80)->super_MessageLite;
    to_process.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    protobuf::MessageLite::SerializeAsString_abi_cxx11_(&local_1b8,(MessageLite *)local_188);
    local_198 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_1b8);
    bVar2 = protobuf::MessageLite::ParseFromString(this_00,local_198);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/file.cc"
                 ,0x432,"fd_proto->ParseFromString(linkedin_fd_proto.SerializeAsString())");
      to_process.
      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_1d0);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_1b9,pLVar6);
    }
    if ((to_process.
         super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_1d0);
    }
    std::__cxx11::string::~string((string *)&local_1b8);
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_188);
    local_208 = std::
                unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                ::get(&local_80);
    local_200 = &local_208;
    local_1f8 = 1;
    std::allocator<const_google::protobuf::Message_*>::allocator
              ((allocator<const_google::protobuf::Message_*> *)((long)&msg + 7));
    __l._M_len = local_1f8;
    __l._M_array = local_200;
    std::
    vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>::
    vector((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            *)local_1f0,__l,(allocator<const_google::protobuf::Message_*> *)((long)&msg + 7));
    std::allocator<const_google::protobuf::Message_*>::~allocator
              ((allocator<const_google::protobuf::Message_*> *)((long)&msg + 7));
    while( true ) {
      bVar2 = std::
              vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
              ::empty((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                       *)local_1f0);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      ppMVar7 = std::
                vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                ::back((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                        *)local_1f0);
      fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppMVar7;
      std::
      vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ::pop_back((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                  *)local_1f0);
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)&reflection);
      this_01 = Message::GetReflection
                          ((Message *)
                           fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Reflection::ListFields
                (this_01,(Message *)
                         fields.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)&reflection);
      __end4 = std::
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        *)&reflection);
      field = (FieldDescriptor *)
              std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     *)&reflection);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end4,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                    *)&field);
        if (!bVar2) break;
        ppFVar8 = __gnu_cxx::
                  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                  ::operator*(&__end4);
        desc = (Descriptor *)*ppFVar8;
        bVar2 = FieldDescriptor::is_extension((FieldDescriptor *)desc);
        if (bVar2) {
          pDVar4 = Message::GetDescriptor
                             ((Message *)
                              fields.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_260 = pDVar4;
          sVar10 = Descriptor::full_name(pDVar4);
          local_268 = sVar10._M_str;
          field_msg = (Descriptor *)sVar10._M_len;
          ppDVar9 = absl::lts_20250127::container_internal::
                    btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                    ::operator[]<std::basic_string_view<char,std::char_traits<char>>>
                              ((btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                                *)out,(key_arg<std::basic_string_view<char>_> *)&field_msg);
          *ppDVar9 = pDVar4;
        }
        local_278 = FieldDescriptor::message_type((FieldDescriptor *)desc);
        if (local_278 != (Descriptor *)0x0) {
          bVar2 = FieldDescriptor::is_extension((FieldDescriptor *)desc);
          pDVar4 = local_278;
          if (bVar2) {
            sVar10 = Descriptor::full_name(local_278);
            _auStack_288 = sVar10;
            ppDVar9 = absl::lts_20250127::container_internal::
                      btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                      ::operator[]<std::basic_string_view<char,std::char_traits<char>>>
                                ((btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Descriptor_const*,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::Descriptor_const*>>,256,false>>>
                                  *)out,(key_arg<std::basic_string_view<char>_> *)auStack_288);
            *ppDVar9 = pDVar4;
          }
          bVar2 = FieldDescriptor::is_repeated((FieldDescriptor *)desc);
          if (bVar2) {
            local_28c = 0;
            while( true ) {
              iVar1 = local_28c;
              iVar3 = Reflection::FieldSize
                                (this_01,(Message *)
                                         fields.
                                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (FieldDescriptor *)desc);
              if (iVar3 <= iVar1) break;
              local_298 = Reflection::GetRepeatedMessage
                                    (this_01,(Message *)
                                             fields.
                                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (FieldDescriptor *)desc,local_28c);
              std::
              vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
              ::push_back((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                           *)local_1f0,&local_298);
              local_28c = local_28c + 1;
            }
          }
          else {
            local_2a0 = Reflection::GetMessage
                                  (this_01,(Message *)
                                           fields.
                                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (FieldDescriptor *)desc,(MessageFactory *)0x0);
            std::
            vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            ::push_back((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                         *)local_1f0,&local_2a0);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
        ::operator++(&__end4);
      }
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)&reflection);
    }
    std::
    vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>::
    ~vector((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
             *)local_1f0);
    std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
    ~unique_ptr(&local_80);
    DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)&fd_proto);
  }
  return;
}

Assistant:

static void GatherAllCustomOptionTypes(
    const FileDescriptor* file,
    absl::btree_map<absl::string_view, const Descriptor*>& out) {
  const DescriptorPool* pool = file->pool();
  const Descriptor* fd_proto_descriptor = pool->FindMessageTypeByName(
      FileDescriptorProto::descriptor()->full_name());
  // Not all pools have descriptor.proto in them. In these cases there for sure
  // are no custom options.
  if (fd_proto_descriptor == nullptr) {
    return;
  }

  // It's easier to inspect file as a proto, because we can use reflection on
  // the proto to iterate over all content.
  // However, we can't use the generated proto linked into the proto compiler
  // for this, since it doesn't know the extensions that are potentially present
  // the protos that are being compiled.
  // Use a dynamic one from the correct pool to parse them.
  DynamicMessageFactory factory(pool);
  std::unique_ptr<Message> fd_proto(
      factory.GetPrototype(fd_proto_descriptor)->New());

  {
    FileDescriptorProto linkedin_fd_proto;
    file->CopyTo(&linkedin_fd_proto);
    ABSL_CHECK(
        fd_proto->ParseFromString(linkedin_fd_proto.SerializeAsString()));
  }

  // Now find all the messages used, recursively.
  std::vector<const Message*> to_process = {fd_proto.get()};
  while (!to_process.empty()) {
    const Message& msg = *to_process.back();
    to_process.pop_back();

    std::vector<const FieldDescriptor*> fields;
    const Reflection& reflection = *msg.GetReflection();
    reflection.ListFields(msg, &fields);

    for (auto* field : fields) {
      if (field->is_extension()) {
        // Always add the extended.
        const Descriptor* desc = msg.GetDescriptor();
        out[desc->full_name()] = desc;
      }

      // Add and recurse of the extendee if it is a message.
      const auto* field_msg = field->message_type();
      if (field_msg == nullptr) continue;
      if (field->is_extension()) {
        out[field_msg->full_name()] = field_msg;
      }
      if (field->is_repeated()) {
        for (int i = 0; i < reflection.FieldSize(msg, field); i++) {
          to_process.push_back(&reflection.GetRepeatedMessage(msg, field, i));
        }
      } else {
        to_process.push_back(&reflection.GetMessage(msg, field));
      }
    }
  }
}